

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall
FIX::SocketMonitor::buildSet(SocketMonitor *this,Sockets *sockets,pollfd *pfds,short events)

{
  bool bVar1;
  reference piVar2;
  _Self local_48;
  _Base_ptr local_40;
  uint local_34;
  iterator iStack_30;
  uint i;
  const_iterator iter;
  short events_local;
  pollfd *pfds_local;
  Sockets *sockets_local;
  SocketMonitor *this_local;
  
  iter._M_node._6_2_ = events;
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&stack0xffffffffffffffd0);
  local_34 = 0;
  local_40 = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(sockets);
  iStack_30 = (iterator)local_40;
  while( true ) {
    local_48._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(sockets);
    bVar1 = std::operator!=(&stack0xffffffffffffffd0,&local_48);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&stack0xffffffffffffffd0);
    pfds[local_34].fd = *piVar2;
    pfds[local_34].events = iter._M_node._6_2_;
    pfds[local_34].revents = 0;
    local_34 = local_34 + 1;
    std::_Rb_tree_const_iterator<int>::operator++(&stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

void SocketMonitor::buildSet(const Sockets &sockets, struct pollfd *pfds, short events) {
  Sockets::const_iterator iter;
  unsigned int i = 0;
  for (iter = sockets.begin(); iter != sockets.end(); ++iter) {
    pfds[i].fd = *iter;
    pfds[i].events = events;
    pfds[i].revents = 0;
    i += 1;
  }
}